

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQInteger __thiscall SQSharedState::GetMetaMethodIdxByName(SQSharedState *this,SQObjectPtr *name)

{
  bool bVar1;
  int *in_RSI;
  SQObjectPtr ret;
  SQObjectPtr *this_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  SQTable *in_stack_ffffffffffffffd8;
  SQObjectValue local_20;
  SQObjectValue local_8;
  
  if (*in_RSI == 0x8000010) {
    this_00 = (SQObjectPtr *)&stack0xffffffffffffffd8;
    ::SQObjectPtr::SQObjectPtr(this_00);
    bVar1 = SQTable::Get(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                         (SQObjectPtr *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (bVar1) {
      local_8 = local_20;
    }
    else {
      local_8.nInteger = -1;
    }
    ::SQObjectPtr::~SQObjectPtr(this_00);
  }
  else {
    local_8.nInteger = -1;
  }
  return (SQInteger)local_8.pTable;
}

Assistant:

SQInteger SQSharedState::GetMetaMethodIdxByName(const SQObjectPtr &name)
{
    if(type(name) != OT_STRING)
        return -1;
    SQObjectPtr ret;
    if(_table(_metamethodsmap)->Get(name,ret)) {
        return _integer(ret);
    }
    return -1;
}